

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

void av1_set_mb_wiener_variance(AV1_COMP *cpi)

{
  byte bVar1;
  BLOCK_SIZE bsize;
  SequenceHeader *pSVar2;
  int iVar3;
  FILE *__stream;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int c;
  uint uVar11;
  int iVar12;
  int rate_sum;
  int iVar13;
  int r;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double sum_est_rate;
  double sum_rec_distortion;
  MB_MODE_INFO *mbmi_ptr;
  MB_MODE_INFO mbmi;
  tran_low_t coeff [1024];
  int16_t src_diff [1024];
  tran_low_t qcoeff [1024];
  double local_3958;
  double local_3950;
  uint local_393c;
  double local_3928;
  double local_3920;
  MB_MODE_INFO *local_3918;
  MB_MODE_INFO local_3910;
  float local_3860 [1024];
  int16_t local_2860 [1024];
  tran_low_t local_2060 [1024];
  tran_low_t local_1060 [1036];
  
  pSVar2 = (cpi->common).seq_params;
  iVar3 = aom_realloc_frame_buffer
                    (&((cpi->common).cur_frame)->buf,(cpi->common).width,(cpi->common).height,
                     pSVar2->subsampling_x,pSVar2->subsampling_y,(uint)pSVar2->use_highbitdepth,
                     (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,
                     (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                     cpi->alloc_pyramid,0);
  if (iVar3 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer");
  }
  av1_alloc_mb_wiener_var_pred_buf(&cpi->common,&cpi->td);
  cpi->norm_wiener_variance = 0;
  memset(&local_3910,0,0xb0);
  (cpi->td).mb.e_mbd.mi = &local_3918;
  (cpi->common).quant_params.base_qindex = (cpi->oxcf).rc_cfg.cq_level;
  local_3918 = &local_3910;
  av1_frame_init_quantizer(cpi);
  local_3920 = 0.0;
  local_3928 = 0.0;
  iVar3 = (cpi->mt_info).num_workers;
  iVar12 = (cpi->mt_info).num_mod_workers[0xb];
  if (iVar12 < iVar3) {
    iVar3 = iVar12;
  }
  (cpi->mt_info).intra_mt.intra_sync_read_ptr = av1_row_mt_sync_read_dummy;
  (cpi->mt_info).intra_mt.intra_sync_write_ptr = av1_row_mt_sync_write_dummy;
  if ((iVar3 < 2) || ((cpi->oxcf).intra_mode_cfg.auto_intra_tools_off != false)) {
    if (0 < (cpi->frame_info).mi_rows) {
      bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [cpi->weber_bsize];
      iVar3 = 0;
      do {
        av1_calc_mb_wiener_var_row
                  (cpi,&(cpi->td).mb,&(cpi->td).mb.e_mbd,iVar3,local_2860,(tran_low_t *)local_3860,
                   local_1060,local_2060,&local_3920,&local_3928,(cpi->td).wiener_tmp_pred_buf);
        iVar3 = iVar3 + (uint)bVar1;
      } while (iVar3 < (cpi->frame_info).mi_rows);
    }
  }
  else {
    (cpi->mt_info).intra_mt.intra_sync_read_ptr = av1_row_mt_sync_read;
    (cpi->mt_info).intra_mt.intra_sync_write_ptr = av1_row_mt_sync_write;
    av1_calc_mb_wiener_var_mt(cpi,iVar3,&local_3920,&local_3928);
  }
  if (((((cpi->oxcf).intra_mode_cfg.auto_intra_tools_off == true) &&
       ((cpi->common).quant_params.base_qindex < 0x80)) &&
      (iVar3 = (cpi->common).height * (cpi->common).width, 2.0 < local_3928 / (double)(iVar3 * 100))
      ) && (local_3920 / (double)iVar3 < 4.0)) {
    (cpi->oxcf).intra_mode_cfg.enable_smooth_intra = false;
    (cpi->oxcf).intra_mode_cfg.enable_paeth_intra = false;
    (cpi->oxcf).intra_mode_cfg.enable_cfl_intra = false;
    (cpi->oxcf).intra_mode_cfg.enable_diagonal_intra = false;
  }
  if ((cpi->oxcf).enable_rate_guide_deltaq != 0) {
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [cpi->weber_bsize];
    __stream = fopen64((cpi->oxcf).rate_distribution_info,"r");
    if (__stream != (FILE *)0x0) {
      iVar3 = (cpi->frame_info).mi_rows;
      bVar16 = 0 < iVar3;
      if (iVar3 < 1) {
        local_3950 = 0.0;
      }
      else {
        local_3950 = 0.0;
        bVar16 = true;
        uVar8 = 0;
        do {
          iVar3 = (cpi->frame_info).mi_cols;
          bVar7 = 0 < iVar3;
          if (0 < iVar3) {
            uVar15 = 0;
            do {
              iVar3 = __isoc99_fscanf(__stream,"%f",local_3860);
              if (iVar3 != 1) {
                fclose(__stream);
                break;
              }
              local_3950 = local_3950 + (double)local_3860[0];
              cpi->ext_rate_distribution
              [(int)((int)(uVar15 / bVar1) + (uVar8 / bVar1) * (cpi->frame_info).mi_cols)] =
                   (double)local_3860[0];
              uVar14 = (int)uVar15 + 4;
              uVar15 = (ulong)uVar14;
              iVar3 = (cpi->frame_info).mi_cols;
              bVar7 = (int)uVar14 < iVar3;
            } while ((int)uVar14 < iVar3);
          }
          if (bVar7) break;
          uVar8 = uVar8 + 4;
          iVar3 = (cpi->frame_info).mi_rows;
          bVar16 = (int)uVar8 < iVar3;
        } while ((int)uVar8 < iVar3);
      }
      if (!bVar16) {
        fclose(__stream);
        iVar3 = (cpi->frame_info).mi_rows;
        if (iVar3 < 1) {
          dVar18 = 0.0;
        }
        else {
          iVar12 = (cpi->frame_info).mi_cols;
          uVar8 = 0;
          iVar9 = 0;
          do {
            if (0 < iVar12) {
              iVar10 = 0;
              do {
                uVar14 = 0;
                iVar13 = 0;
                do {
                  uVar11 = 0;
                  do {
                    iVar13 = iVar13 + cpi->prep_rate_estimates
                                      [(iVar10 + uVar11) / (uint)bVar1 +
                                       ((uVar14 | uVar8) / (uint)bVar1) * iVar12];
                    uVar11 = uVar11 + bVar1;
                  } while (uVar11 < 4);
                  uVar14 = uVar14 + bVar1;
                } while (uVar14 < 4);
                iVar9 = iVar9 + iVar13;
                iVar10 = iVar10 + 4;
              } while (iVar10 < iVar12);
            }
            uVar8 = uVar8 + 4;
          } while ((int)uVar8 < iVar3);
          dVar18 = (double)iVar9;
        }
        cpi->ext_rate_scale = dVar18 / local_3950;
      }
    }
  }
  bsize = ((cpi->common).seq_params)->sb_size;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  dVar17 = 0.0;
  dVar18 = 0.0;
  if (0 < (cpi->common).mi_params.mi_rows) {
    iVar3 = 0;
    dVar18 = 0.0;
    do {
      local_393c = (uint)bVar1;
      if (0 < (cpi->common).mi_params.mi_cols) {
        iVar12 = 0;
        do {
          iVar9 = get_var_perceptual_ai(cpi,bsize,iVar3,iVar12);
          iVar4 = get_satd(cpi,bsize,iVar3,iVar12);
          iVar5 = get_sse(cpi,bsize,iVar3,iVar12);
          dVar20 = (double)iVar5;
          if (dVar20 < 0.0) {
            dVar20 = sqrt(dVar20);
          }
          else {
            dVar20 = SQRT(dVar20);
          }
          dVar19 = log((double)iVar9);
          dVar18 = dVar18 + dVar19 * ((double)iVar4 / dVar20);
          dVar17 = dVar17 + (double)iVar4 / dVar20;
          iVar12 = iVar12 + local_393c;
        } while (iVar12 < (cpi->common).mi_params.mi_cols);
      }
      iVar3 = iVar3 + (uint)bVar1;
    } while (iVar3 < (cpi->common).mi_params.mi_rows);
  }
  lVar6 = 1;
  if (0.0 < dVar17) {
    dVar18 = exp(dVar18 / dVar17);
    lVar6 = (long)dVar18;
  }
  if (lVar6 < 2) {
    lVar6 = 1;
  }
  cpi->norm_wiener_variance = lVar6;
  iVar3 = 0;
  do {
    dVar18 = 0.0;
    local_3958 = 0.0;
    if (0 < (cpi->common).mi_params.mi_rows) {
      iVar12 = 0;
      local_3958 = 0.0;
      do {
        if (0 < (cpi->common).mi_params.mi_cols) {
          iVar9 = 0;
          do {
            iVar10 = get_var_perceptual_ai(cpi,bsize,iVar12,iVar9);
            lVar6 = cpi->norm_wiener_variance;
            dVar19 = (double)lVar6 / (double)iVar10;
            dVar17 = get_max_scale(cpi,((cpi->common).seq_params)->sb_size,iVar12,iVar9);
            dVar20 = 1.0;
            if (1.0 <= dVar17) {
              dVar20 = dVar17;
            }
            if (4.0 <= dVar19) {
              dVar19 = 4.0;
            }
            if (dVar19 <= 0.25) {
              dVar19 = 0.25;
            }
            if (1.0 / dVar20 <= dVar19) {
              iVar4 = get_satd(cpi,bsize,iVar12,iVar9);
              iVar5 = get_sse(cpi,bsize,iVar12,iVar9);
              dVar17 = (double)iVar5;
              if (dVar17 < 0.0) {
                dVar17 = sqrt(dVar17);
              }
              else {
                dVar17 = SQRT(dVar17);
              }
              dVar20 = log((double)(int)((double)lVar6 / dVar19));
              local_3958 = local_3958 + dVar20 * ((double)iVar4 / dVar17);
              dVar18 = dVar18 + (double)iVar4 / dVar17;
            }
            iVar9 = iVar9 + (uint)bVar1;
          } while (iVar9 < (cpi->common).mi_params.mi_cols);
        }
        iVar12 = iVar12 + (uint)bVar1;
      } while (iVar12 < (cpi->common).mi_params.mi_rows);
    }
    if (0.0 < dVar18) {
      dVar18 = exp(local_3958 / dVar18);
      cpi->norm_wiener_variance = (long)dVar18;
    }
    lVar6 = cpi->norm_wiener_variance;
    if (lVar6 < 2) {
      lVar6 = 1;
    }
    cpi->norm_wiener_variance = lVar6;
    bVar16 = iVar3 == 0;
    iVar3 = iVar3 + 1;
  } while (bVar16);
  (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)0x0;
  aom_free_frame_buffer(&((cpi->common).cur_frame)->buf);
  aom_free((cpi->td).wiener_tmp_pred_buf);
  (cpi->td).wiener_tmp_pred_buf = (uint8_t *)0x0;
  return;
}

Assistant:

void av1_set_mb_wiener_variance(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
          NULL, cpi->alloc_pyramid, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");
  av1_alloc_mb_wiener_var_pred_buf(&cpi->common, &cpi->td);
  cpi->norm_wiener_variance = 0;

  MACROBLOCK *x = &cpi->td.mb;
  MACROBLOCKD *xd = &x->e_mbd;
  // xd->mi needs to be setup since it is used in av1_frame_init_quantizer.
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  cm->quant_params.base_qindex = cpi->oxcf.rc_cfg.cq_level;
  av1_frame_init_quantizer(cpi);

  double sum_rec_distortion = 0.0;
  double sum_est_rate = 0.0;

  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
  AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  intra_mt->intra_sync_read_ptr = av1_row_mt_sync_read_dummy;
  intra_mt->intra_sync_write_ptr = av1_row_mt_sync_write_dummy;
  // Calculate differential contrast for each block for the entire image.
  // TODO(chengchen): properly accumulate the distortion and rate in
  // av1_calc_mb_wiener_var_mt(). Until then, call calc_mb_wiener_var() if
  // auto_intra_tools_off is true.
  if (num_workers > 1 && !cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
    intra_mt->intra_sync_read_ptr = av1_row_mt_sync_read;
    intra_mt->intra_sync_write_ptr = av1_row_mt_sync_write;
    av1_calc_mb_wiener_var_mt(cpi, num_workers, &sum_rec_distortion,
                              &sum_est_rate);
  } else {
    calc_mb_wiener_var(cpi, &sum_rec_distortion, &sum_est_rate);
  }

  // Determine whether to turn off several intra coding tools.
  automatic_intra_tools_off(cpi, sum_rec_distortion, sum_est_rate);

  // Read external rate distribution and use it to guide delta quantization
  if (cpi->oxcf.enable_rate_guide_deltaq) ext_rate_guided_quantization(cpi);

  const BLOCK_SIZE norm_block_size = cm->seq_params->sb_size;
  cpi->norm_wiener_variance = estimate_wiener_var_norm(cpi, norm_block_size);
  const int norm_step = mi_size_wide[norm_block_size];

  double sb_wiener_log = 0;
  double sb_count = 0;
  for (int its_cnt = 0; its_cnt < 2; ++its_cnt) {
    sb_wiener_log = 0;
    sb_count = 0;
    for (int mi_row = 0; mi_row < cm->mi_params.mi_rows; mi_row += norm_step) {
      for (int mi_col = 0; mi_col < cm->mi_params.mi_cols;
           mi_col += norm_step) {
        int sb_wiener_var =
            get_var_perceptual_ai(cpi, norm_block_size, mi_row, mi_col);

        double beta = (double)cpi->norm_wiener_variance / sb_wiener_var;
        double min_max_scale = AOMMAX(
            1.0, get_max_scale(cpi, cm->seq_params->sb_size, mi_row, mi_col));

        beta = AOMMIN(beta, 4);
        beta = AOMMAX(beta, 0.25);

        if (beta < 1 / min_max_scale) continue;

        sb_wiener_var = (int)(cpi->norm_wiener_variance / beta);

        int64_t satd = get_satd(cpi, norm_block_size, mi_row, mi_col);
        int64_t sse = get_sse(cpi, norm_block_size, mi_row, mi_col);
        double scaled_satd = (double)satd / sqrt((double)sse);
        sb_wiener_log += scaled_satd * log(sb_wiener_var);
        sb_count += scaled_satd;
      }
    }

    if (sb_count > 0)
      cpi->norm_wiener_variance = (int64_t)(exp(sb_wiener_log / sb_count));
    cpi->norm_wiener_variance = AOMMAX(1, cpi->norm_wiener_variance);
  }

  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
  aom_free_frame_buffer(&cm->cur_frame->buf);
  av1_dealloc_mb_wiener_var_pred_buf(&cpi->td);
}